

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encryptor_test.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  allocator local_2f1;
  string key;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  string local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  string local_30;
  
  if (argc != 2) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"usage: provide test directory ");
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  else {
    std::__cxx11::string::string((string *)&local_30,argv[1],(allocator *)&key);
    test_key(&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    poVar1 = std::operator<<((ostream *)&std::cout,"- Testing basic cryptography functions");
    std::endl<char,std::char_traits<char>>(poVar1);
    std::__cxx11::string::string
              ((string *)&key,"261965ba80a79c034c9ae366a19a2627",(allocator *)&local_2d0);
    poVar1 = std::operator<<((ostream *)&std::cout,"- Testing internal cryptography library");
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,"-- Testing hmac cookies signature");
    std::endl<char,std::char_traits<char>>(poVar1);
    std::__cxx11::string::string((string *)&local_50,"sha1",(allocator *)&local_2d0);
    std::__cxx11::string::string((string *)&local_70,(string *)&key);
    run_test<cppcms::sessions::impl::hmac_factory>(&local_50,&local_70,true);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::string((string *)&local_90,"md5",(allocator *)&local_2d0);
    std::__cxx11::string::string((string *)&local_b0,(string *)&key);
    run_test<cppcms::sessions::impl::hmac_factory>(&local_90,&local_b0,true);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_90);
    poVar1 = std::operator<<((ostream *)&std::cout,"- Testing external cryptography library");
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,"-- Testing hmac cookies signature");
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,"--- hmac-sha224");
    std::endl<char,std::char_traits<char>>(poVar1);
    std::__cxx11::string::string((string *)&local_d0,"sha224",(allocator *)&local_2d0);
    std::__cxx11::string::string((string *)&local_f0,(string *)&key);
    run_test<cppcms::sessions::impl::hmac_factory>(&local_d0,&local_f0,true);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_d0);
    poVar1 = std::operator<<((ostream *)&std::cout,"--- hmac-sha256");
    std::endl<char,std::char_traits<char>>(poVar1);
    std::__cxx11::string::string((string *)&local_110,"sha256",(allocator *)&local_2d0);
    std::__cxx11::string::string((string *)&local_130,(string *)&key);
    run_test<cppcms::sessions::impl::hmac_factory>(&local_110,&local_130,true);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_110);
    poVar1 = std::operator<<((ostream *)&std::cout,"--- hmac-sha384");
    std::endl<char,std::char_traits<char>>(poVar1);
    std::__cxx11::string::string((string *)&local_150,"sha384",(allocator *)&local_2d0);
    std::__cxx11::string::string((string *)&local_170,(string *)&key);
    run_test<cppcms::sessions::impl::hmac_factory>(&local_150,&local_170,true);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_150);
    poVar1 = std::operator<<((ostream *)&std::cout,"--- hmac-sha512");
    std::endl<char,std::char_traits<char>>(poVar1);
    std::__cxx11::string::string((string *)&local_190,"sha512",(allocator *)&local_2d0);
    std::__cxx11::string::string((string *)&local_1b0,(string *)&key);
    run_test<cppcms::sessions::impl::hmac_factory>(&local_190,&local_1b0,true);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_190);
    poVar1 = std::operator<<((ostream *)&std::cout,"-- Testing aes cookies encryption");
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,"--- aes");
    std::endl<char,std::char_traits<char>>(poVar1);
    std::__cxx11::string::string((string *)&local_1d0,"aes",(allocator *)&local_2d0);
    std::__cxx11::string::string((string *)&local_1f0,(string *)&key);
    run_test<cppcms::sessions::impl::aes_factory>(&local_1d0,&local_1f0,false);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::__cxx11::string::~string((string *)&local_1d0);
    poVar1 = std::operator<<((ostream *)&std::cout,"--- aes128");
    std::endl<char,std::char_traits<char>>(poVar1);
    std::__cxx11::string::string((string *)&local_210,"aes128",(allocator *)&local_2d0);
    std::__cxx11::string::string((string *)&local_230,(string *)&key);
    run_test<cppcms::sessions::impl::aes_factory>(&local_210,&local_230,false);
    std::__cxx11::string::~string((string *)&local_230);
    std::__cxx11::string::~string((string *)&local_210);
    poVar1 = std::operator<<((ostream *)&std::cout,"--- aes192");
    std::endl<char,std::char_traits<char>>(poVar1);
    std::__cxx11::string::string((string *)&local_250,"aes192",&local_2f1);
    std::__cxx11::string::substr((ulong)&local_2d0,(ulong)&key);
    std::operator+(&local_270,&key,&local_2d0);
    run_test<cppcms::sessions::impl::aes_factory>(&local_250,&local_270,false);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&local_2d0);
    std::__cxx11::string::~string((string *)&local_250);
    poVar1 = std::operator<<((ostream *)&std::cout,"--- aes256");
    std::endl<char,std::char_traits<char>>(poVar1);
    std::__cxx11::string::string((string *)&local_290,"aes256",(allocator *)&local_2d0);
    std::operator+(&local_2b0,&key,&key);
    run_test<cppcms::sessions::impl::aes_factory>(&local_290,&local_2b0,false);
    std::__cxx11::string::~string((string *)&local_2b0);
    std::__cxx11::string::~string((string *)&local_290);
    std::__cxx11::string::~string((string *)&key);
  }
  return (uint)(argc != 2);
}

Assistant:

int main(int argc,char **argv)
{
	if(argc!=2) {
		std::cerr << "usage: provide test directory " << std::endl;
		return 1;
	}
	try {
		test_key(argv[1]);
		std::cout << "- Testing basic cryptography functions" << std::endl;

		std::string key="261965ba80a79c034c9ae366a19a2627";

		std::cout << "- Testing internal cryptography library" << std::endl;
		std::cout << "-- Testing hmac cookies signature" << std::endl;
		run_test<cppcms::sessions::impl::hmac_factory>("sha1",key,true);
		run_test<cppcms::sessions::impl::hmac_factory>("md5",key,true);
		#if defined(CPPCMS_HAVE_GCRYPT) || defined(CPPCMS_HAVE_OPENSSL)
		std::cout << "- Testing external cryptography library" << std::endl;
		std::cout << "-- Testing hmac cookies signature" << std::endl;
		std::cout << "--- hmac-sha224" << std::endl;
		run_test<cppcms::sessions::impl::hmac_factory>("sha224",key,true);
		std::cout << "--- hmac-sha256" << std::endl;
		run_test<cppcms::sessions::impl::hmac_factory>("sha256",key,true);
		std::cout << "--- hmac-sha384" << std::endl;
		run_test<cppcms::sessions::impl::hmac_factory>("sha384",key,true);
		std::cout << "--- hmac-sha512" << std::endl;
		run_test<cppcms::sessions::impl::hmac_factory>("sha512",key,true);
		std::cout << "-- Testing aes cookies encryption" << std::endl;
		std::cout << "--- aes" << std::endl;
		run_test<cppcms::sessions::impl::aes_factory>("aes",key);
		std::cout << "--- aes128" << std::endl;
		run_test<cppcms::sessions::impl::aes_factory>("aes128",key);
		std::cout << "--- aes192" << std::endl;
		run_test<cppcms::sessions::impl::aes_factory>("aes192",key + key.substr(16));
		std::cout << "--- aes256" << std::endl;
		run_test<cppcms::sessions::impl::aes_factory>("aes256",key + key);
		#endif
	}
	catch(std::exception const &e) {
		std::cerr << "Failed:"<<e.what()<<std::endl;
		return 1;
	}
	return 0;
}